

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::StairsRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::TransformerLinLin>::operator()
          (StairsRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::TransformerLinLin> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  float fVar2;
  ImVec2 IVar3;
  int iVar4;
  ImU32 IVar5;
  GetterXsYs<unsigned_int> *pGVar6;
  ImDrawVert *pIVar7;
  uint *puVar8;
  bool bVar9;
  long lVar10;
  ImVec2 IVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  pGVar6 = this->Getter;
  iVar4 = pGVar6->Count;
  lVar10 = (long)(((pGVar6->Offset + prim + 1) % iVar4 + iVar4) % iVar4) * (long)pGVar6->Stride;
  iVar4 = this->Transformer->YAxis;
  IVar11.x = (float)(((double)*(uint *)((long)pGVar6->Xs + lVar10) -
                     (GImPlot->CurrentPlot->XAxis).Range.Min) * GImPlot->Mx +
                    (double)GImPlot->PixelRange[iVar4].Min.x);
  fVar12 = (float)(((double)*(uint *)((long)pGVar6->Ys + lVar10) -
                   GImPlot->CurrentPlot->YAxis[iVar4].Range.Min) * GImPlot->My[iVar4] +
                  (double)GImPlot->PixelRange[iVar4].Min.y);
  fVar2 = (this->P1).x;
  fVar13 = (this->P1).y;
  fVar14 = fVar13;
  if (fVar12 <= fVar13) {
    fVar14 = fVar12;
  }
  bVar9 = false;
  if ((fVar14 < (cull_rect->Max).y) &&
     (fVar13 = (float)(-(uint)(fVar12 <= fVar13) & (uint)fVar13 |
                      ~-(uint)(fVar12 <= fVar13) & (uint)fVar12), pfVar1 = &(cull_rect->Min).y,
     bVar9 = false, *pfVar1 <= fVar13 && fVar13 != *pfVar1)) {
    fVar13 = fVar2;
    if (IVar11.x <= fVar2) {
      fVar13 = IVar11.x;
    }
    if (fVar13 < (cull_rect->Max).x) {
      fVar13 = (float)(~-(uint)(IVar11.x <= fVar2) & (uint)IVar11.x |
                      -(uint)(IVar11.x <= fVar2) & (uint)fVar2);
      bVar9 = (cull_rect->Min).x <= fVar13 && fVar13 != (cull_rect->Min).x;
    }
  }
  if (bVar9 != false) {
    fVar13 = (this->P1).y;
    fVar14 = fVar13 + this->HalfWeight;
    fVar13 = fVar13 - this->HalfWeight;
    IVar5 = this->Col;
    IVar3 = *uv;
    pIVar7 = DrawList->_VtxWritePtr;
    (pIVar7->pos).x = fVar2;
    (pIVar7->pos).y = fVar14;
    DrawList->_VtxWritePtr->uv = IVar3;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7->col = IVar5;
    pIVar7[1].pos.x = IVar11.x;
    pIVar7[1].pos.y = fVar13;
    DrawList->_VtxWritePtr[1].uv = IVar3;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7[1].col = IVar5;
    pIVar7[2].pos.x = fVar2;
    pIVar7[2].pos.y = fVar13;
    pIVar7[2].uv = IVar3;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7[2].col = IVar5;
    pIVar7[3].pos.x = IVar11.x;
    pIVar7[3].pos.y = fVar14;
    pIVar7[3].uv = IVar3;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7[3].col = IVar5;
    DrawList->_VtxWritePtr = pIVar7 + 4;
    puVar8 = DrawList->_IdxWritePtr;
    *puVar8 = DrawList->_VtxCurrentIdx;
    puVar8[1] = DrawList->_VtxCurrentIdx + 1;
    puVar8[2] = DrawList->_VtxCurrentIdx + 2;
    puVar8[3] = DrawList->_VtxCurrentIdx;
    puVar8[4] = DrawList->_VtxCurrentIdx + 1;
    puVar8[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar8 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
    fVar14 = IVar11.x - this->HalfWeight;
    fVar13 = this->HalfWeight + IVar11.x;
    fVar2 = (this->P1).y;
    IVar5 = this->Col;
    IVar3 = *uv;
    pIVar7[4].pos.x = fVar14;
    pIVar7[4].pos.y = fVar12;
    DrawList->_VtxWritePtr->uv = IVar3;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7->col = IVar5;
    pIVar7[1].pos.x = fVar13;
    pIVar7[1].pos.y = fVar2;
    DrawList->_VtxWritePtr[1].uv = IVar3;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7[1].col = IVar5;
    pIVar7[2].pos.x = fVar14;
    pIVar7[2].pos.y = fVar2;
    pIVar7[2].uv = IVar3;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7[2].col = IVar5;
    pIVar7[3].pos.x = fVar13;
    pIVar7[3].pos.y = fVar12;
    pIVar7[3].uv = IVar3;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7[3].col = IVar5;
    DrawList->_VtxWritePtr = pIVar7 + 4;
    puVar8 = DrawList->_IdxWritePtr;
    *puVar8 = DrawList->_VtxCurrentIdx;
    puVar8[1] = DrawList->_VtxCurrentIdx + 1;
    puVar8[2] = DrawList->_VtxCurrentIdx + 2;
    puVar8[3] = DrawList->_VtxCurrentIdx;
    puVar8[4] = DrawList->_VtxCurrentIdx + 1;
    puVar8[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar8 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  IVar11.y = fVar12;
  this->P1 = IVar11;
  return bVar9;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddRectFilled(ImVec2(P1.x, P1.y + HalfWeight), ImVec2(P2.x, P1.y - HalfWeight), Col, DrawList, uv);
        AddRectFilled(ImVec2(P2.x - HalfWeight, P2.y), ImVec2(P2.x + HalfWeight, P1.y), Col, DrawList, uv);

        // AddLine(P1, P12, Weight, Col, DrawList, uv);
        // AddLine(P12, P2, Weight, Col, DrawList, uv);
        P1 = P2;
        return true;
    }